

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptScopedCompoundStatement(HlslGrammar *this,TIntermNode **statement)

{
  bool bVar1;
  
  TSymbolTable::push((this->parseContext->super_TParseContextBase).symbolTable);
  bVar1 = acceptCompoundStatement(this,statement);
  TSymbolTable::pop((this->parseContext->super_TParseContextBase).symbolTable,
                    (TPrecisionQualifier *)0x0);
  return bVar1;
}

Assistant:

bool HlslGrammar::acceptScopedCompoundStatement(TIntermNode*& statement)
{
    parseContext.pushScope();
    bool result = acceptCompoundStatement(statement);
    parseContext.popScope();

    return result;
}